

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall MidiSimulationDataGenerator::loadSampleData(MidiSimulationDataGenerator *this)

{
  this->mMidiBuf[0] = 0x90;
  this->mMidiBuf[1] = 0x3f;
  this->mMidiBuf[2] = 0x40;
  this->mMidiBuf[3] = 0x81;
  this->mMidiBuf[4] = 0x3f;
  this->mMidiBuf[5] = 0x40;
  this->mMidiBuf[6] = 0x92;
  this->mMidiBuf[7] = 0x3c;
  this->mMidiBuf[8] = 0x40;
  this->mMidiBuf[9] = 0x83;
  this->mMidiBuf[10] = 0x3c;
  this->mMidiBuf[0xb] = 0x40;
  this->mMidiBufIndex = 0;
  this->mMidiBufShortEnd = 0xc;
  return;
}

Assistant:

void MidiSimulationDataGenerator::loadSampleData()
{ // Plausible MIDI for end-user
    mMidiBuf[ 0 ] = 0x90;
    mMidiBuf[ 1 ] = 0x3f;
    mMidiBuf[ 2 ] = 0x40;
    mMidiBuf[ 3 ] = 0x81;
    mMidiBuf[ 4 ] = 0x3f;
    mMidiBuf[ 5 ] = 0x40;
    mMidiBuf[ 6 ] = 0x92;
    mMidiBuf[ 7 ] = 0x3c;
    mMidiBuf[ 8 ] = 0x40;
    mMidiBuf[ 9 ] = 0x83;
    mMidiBuf[ 10 ] = 0x3c;
    mMidiBuf[ 11 ] = 0x40;

    mMidiBufIndex = 0;
    mMidiBufShortEnd = 12; // Needed to prevent reading past the initialized part of the array.
                           /*
                            * 672: 90 3f 40 note on (channel 0): pitch 63, velocity 64
                           480: 80 3f 40 note off (channel 0): pitch 63, velocity 64
                           384: 90 3c 40 note on (channel 0): pitch 60, velocity 64
                           192: 80 3c 40 note off (channel 0): pitch 60, velocity 64
                            */
}